

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Unpack(void *inbuf,int insize,int *position,void *outbuf,int outcount,
                 MPIABI_Datatype datatype,MPIABI_Comm comm)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  ompi_communicator_t *poVar3;
  WPI_Handle<ompi_communicator_t_*> local_48;
  WPI_Handle<ompi_datatype_t_*> local_40;
  MPIABI_Datatype local_38;
  MPIABI_Datatype datatype_local;
  void *pvStack_28;
  int outcount_local;
  void *outbuf_local;
  int *position_local;
  void *pvStack_10;
  int insize_local;
  void *inbuf_local;
  
  local_38 = datatype;
  datatype_local._4_4_ = outcount;
  pvStack_28 = outbuf;
  outbuf_local = position;
  position_local._4_4_ = insize;
  pvStack_10 = inbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,datatype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_48,comm);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_48);
  iVar1 = MPI_Unpack(inbuf,insize,position,outbuf,outcount,poVar2,poVar3);
  return iVar1;
}

Assistant:

int MPIABI_Unpack(
  const void * inbuf,
  int insize,
  int * position,
  void * outbuf,
  int outcount,
  MPIABI_Datatype datatype,
  MPIABI_Comm comm
) {
  return MPI_Unpack(
    inbuf,
    insize,
    position,
    outbuf,
    outcount,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Comm)(WPI_Comm)comm
  );
}